

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

uint bi_reverse(uint code,int len)

{
  uint uVar1;
  uint uVar2;
  undefined4 local_14;
  undefined4 local_10;
  uint res;
  int len_local;
  uint code_local;
  
  local_14 = 0;
  uVar1 = local_14;
  local_10 = len;
  res = code;
  do {
    local_14 = uVar1;
    uVar2 = res & 1;
    res = res >> 1;
    local_10 = local_10 + -1;
    uVar1 = (uVar2 | local_14) << 1;
  } while (0 < local_10);
  return uVar2 | local_14 & 0x7fffffff;
}

Assistant:

local unsigned bi_reverse(code, len)
    unsigned code; /* the value to invert */
    int len;       /* its bit length */
{
    register unsigned res = 0;
    do {
        res |= code & 1;
        code >>= 1, res <<= 1;
    } while (--len > 0);
    return res >> 1;
}